

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndTabBar(void)

{
  ImGuiWindow *pIVar1;
  ImGuiTabBar *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiTabBar **ppIVar4;
  float fVar5;
  bool tab_bar_appearing;
  ImGuiTabBar *tab_bar;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTabBar *in_stack_00000100;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((pIVar1->SkipItems & 1U) == 0) {
    ppIVar4 = ImVector<ImGuiTabBar_*>::back(&GImGui->CurrentTabBar);
    pIVar2 = *ppIVar4;
    if ((pIVar2->WantLayout & 1U) != 0) {
      TabBarLayout(in_stack_00000100);
    }
    if ((((pIVar2->VisibleTabWasSubmitted & 1U) == 0) && (pIVar2->VisibleTabId != 0)) &&
       (pIVar3->FrameCount <= pIVar2->PrevFrameVisible + 1)) {
      (pIVar1->DC).CursorPos.y = (pIVar2->BarRect).Max.y + pIVar2->ContentsHeight;
    }
    else {
      fVar5 = ImMax<float>((pIVar1->DC).CursorPos.y - (pIVar2->BarRect).Max.y,0.0);
      pIVar2->ContentsHeight = fVar5;
    }
    if ((pIVar2->Flags & 0x100000U) == 0) {
      PopID();
    }
    ImVector<ImGuiTabBar_*>::pop_back(&pIVar3->CurrentTabBar);
  }
  return;
}

Assistant:

void    ImGui::EndTabBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    IM_ASSERT(!g.CurrentTabBar.empty());      // Mismatched BeginTabBar/EndTabBar
    ImGuiTabBar* tab_bar = g.CurrentTabBar.back();
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    // Restore the last visible height if no tab is visible, this reduce vertical flicker/movement when a tabs gets removed without calling SetTabItemClosed().
    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    if (tab_bar->VisibleTabWasSubmitted || tab_bar->VisibleTabId == 0 || tab_bar_appearing)
        tab_bar->ContentsHeight = ImMax(window->DC.CursorPos.y - tab_bar->BarRect.Max.y, 0.0f);
    else
        window->DC.CursorPos.y = tab_bar->BarRect.Max.y + tab_bar->ContentsHeight;

    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        PopID();
    g.CurrentTabBar.pop_back();
}